

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_hashmap.h
# Opt level: O1

scored_action * __thiscall
v_hashmap<unsigned_char_*,_Search::scored_action>::get
          (v_hashmap<unsigned_char_*,_Search::scored_action> *this,uchar **key,uint64_t hash)

{
  hash_elem *phVar1;
  size_t sVar2;
  _func_bool_void_ptr_uchar_ptr_ptr_uchar_ptr_ptr *p_Var3;
  bool bVar4;
  ulong uVar5;
  vw_exception *this_00;
  ulong uVar6;
  ulong uVar7;
  stringstream __msg;
  string sStack_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8;
  
  uVar7 = (long)(this->dat).end_array - (long)(this->dat)._begin >> 5;
  uVar6 = hash % uVar7;
  this->last_position = uVar6;
  while( true ) {
    phVar1 = (this->dat)._begin;
    sVar2 = this->last_position;
    if (phVar1[sVar2].occupied != true) goto LAB_0012d695;
    if (phVar1[sVar2].hash == hash) break;
LAB_0012d603:
    uVar5 = this->last_position + 1;
    if (uVar7 <= uVar5) {
      uVar5 = 0;
    }
    this->last_position = uVar5;
    if (uVar5 == uVar6) {
      std::__cxx11::stringstream::stringstream(local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>
                (&local_1a8,"error: v_hashmap did not grow enough!",0x25);
      this_00 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (this_00,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/v_hashmap.h"
                 ,0xe2,&sStack_1d8);
      __cxa_throw(this_00,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
  }
  p_Var3 = this->equivalent;
  if (p_Var3 != (_func_bool_void_ptr_uchar_ptr_ptr_uchar_ptr_ptr *)0x0 ||
      this->equivalent_no_data != (_func_bool_uchar_ptr_ptr_uchar_ptr_ptr *)0x0) {
    if (p_Var3 == (_func_bool_void_ptr_uchar_ptr_ptr_uchar_ptr_ptr *)0x0) {
      bVar4 = (*this->equivalent_no_data)(key,&phVar1[sVar2].key);
    }
    else {
      bVar4 = (*p_Var3)(this->eq_data,key,&phVar1[sVar2].key);
    }
    if (bVar4 == false) goto LAB_0012d603;
  }
  this = (v_hashmap<unsigned_char_*,_Search::scored_action> *)
         ((this->dat)._begin + this->last_position);
LAB_0012d695:
  return &this->default_value;
}

Assistant:

V& get(const K& key, uint64_t hash)
  {
    size_t sz = base_size();
    size_t first_position = hash % sz;
    last_position = first_position;
    while (true)
    {  // if there's nothing there, obviously we don't contain it
      if (!dat[last_position].occupied)
        return default_value;

      // there's something there: maybe it's us
      if ((dat[last_position].hash == hash) && is_equivalent(key, dat[last_position].key))
        return dat[last_position].val;

      // there's something there that's NOT us -- advance pointer
      // cerr << "+";
      // num_linear_steps++;
      last_position++;
      if (last_position >= sz)
        last_position = 0;

      // check to make sure we haven't cycled around -- this is a bug!
      if (last_position == first_position)
        THROW("error: v_hashmap did not grow enough!");
    }
  }